

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmModuleGenerator::GenerateFunctionHeader(WasmModuleGenerator *this,uint32 index)

{
  undefined1 *puVar1;
  WasmSignature *pWVar2;
  AsmJsVarType type;
  ArgSlot AVar3;
  ushort uVar4;
  Type displayNameLength;
  Type TVar5;
  Local wasmType;
  WasmType wasmType_00;
  AsmJsRetType AVar6;
  WasmFunctionInfo *ptr;
  Recycler *pRVar7;
  char16_t *displayName;
  FunctionBody *ptr_00;
  WasmReaderInfo *ptr_01;
  AsmJsFunctionInfo *this_00;
  Which *ptr_02;
  WasmExport *pWVar8;
  WasmCompilationException *this_01;
  ArgSlot i;
  ulong uVar9;
  size_t count;
  ulong count_00;
  uint uVar10;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  ptr = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,index);
  if (ptr == (WasmFunctionInfo *)0x0) {
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Invalid function index %u",(ulong)index);
    goto LAB_00d6c356;
  }
  displayNameLength = ptr->m_nameLength;
  if (displayNameLength == 0) {
    for (uVar10 = 0; uVar10 < this->m_module->m_exportCount; uVar10 = uVar10 + 1) {
      pWVar8 = Js::WebAssemblyModule::GetExport(this->m_module,uVar10);
      if (((pWVar8 != (WasmExport *)0x0) && (pWVar8->kind == Function)) && (pWVar8->nameLength != 0)
         ) {
        TVar5 = Js::WebAssemblyModule::GetFunctionIndexType(this->m_module,pWVar8->index);
        if ((TVar5 == Function) && (pWVar8->index == ptr->m_number)) {
          count = (size_t)(int)(pWVar8->nameLength + 0x10);
          local_70 = (undefined1  [8])&char16_t::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_ad5ca57;
          data.filename._0_4_ = 0x187;
          data.plusSize = count;
          pRVar7 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_70);
          displayName = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                                  ((Memory *)pRVar7,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                                   count);
          displayNameLength =
               swprintf_s((char16_t_conflict *)displayName,count,(char16_t_conflict *)L"%s[%u]",
                          pWVar8->name);
          goto LAB_00d6bf29;
        }
      }
    }
LAB_00d6bf2e:
    local_70 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x20;
    data.count = (size_t)anon_var_dwarf_ad5ca57;
    data.filename._0_4_ = 0x191;
    pRVar7 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_70);
    displayName = (char16_t *)new__<Memory::Recycler>(0x40,pRVar7,0x59dc42);
    displayNameLength =
         swprintf_s((char16_t_conflict *)displayName,0x20,(char16_t_conflict *)L"wasm-function[%u]",
                    (ulong)ptr->m_number);
  }
  else {
    displayName = (ptr->m_name).ptr;
LAB_00d6bf29:
    if (displayName == (char16_t *)0x0) goto LAB_00d6bf2e;
  }
  ptr_00 = Js::FunctionBody::NewFromRecycler
                     (this->m_scriptContext,displayName,displayNameLength,0,0,this->m_sourceInfo,
                      ((((this->m_sourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr)->
                      sourceContextId,ptr->m_number,ErrorOnNew,Flags_None);
  Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierSet(&ptr->m_body,ptr_00);
  Js::ParseableFunctionInfo::SetSourceInfo(&ptr_00->super_ParseableFunctionInfo,0);
  Js::FunctionBody::AllocateAsmJsFunctionInfo(ptr_00);
  puVar1 = &(ptr_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  *puVar1 = *puVar1 | 0x40;
  puVar1 = &(ptr_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
  *puVar1 = *puVar1 | 0xe;
  local_70 = (undefined1  [8])&WasmReaderInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_ad5ca57;
  data.filename._0_4_ = 0x1ad;
  pRVar7 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_70);
  ptr_01 = (WasmReaderInfo *)new<Memory::Recycler>(0x10,pRVar7,0x37a1d4);
  (ptr_01->m_funcInfo).ptr = (WasmFunctionInfo *)0x0;
  (ptr_01->m_module).ptr = (WebAssemblyModule *)0x0;
  Memory::WriteBarrierPtr<Wasm::WasmFunctionInfo>::WriteBarrierSet
            ((WriteBarrierPtr<Wasm::WasmFunctionInfo> *)ptr_01,ptr);
  Memory::WriteBarrierPtr<Js::WebAssemblyModule>::WriteBarrierSet(&ptr_01->m_module,this->m_module);
  Js::WasmLibrary::ResetFunctionBodyDefaultEntryPoint(ptr_00);
  this_00 = Js::FunctionProxy::
            GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                      ((FunctionProxy *)ptr_00);
  Memory::WriteBarrierPtr<Wasm::WasmReaderInfo>::WriteBarrierSet(&this_00->mWasmReaderInfo,ptr_01);
  Memory::WriteBarrierPtr<Js::WebAssemblyModule>::WriteBarrierSet
            (&this_00->mWasmModule,this->m_module);
  AVar3 = WasmFunctionInfo::GetParamCount(ptr);
  this_00->mArgCount = AVar3;
  Memory::WriteBarrierPtr<Wasm::WasmSignature>::WriteBarrierSet
            (&this_00->mSignature,(ptr->m_signature).ptr);
  uVar4 = 3;
  if (3 < AVar3) {
    uVar4 = AVar3;
  }
  this_00->mArgSizesLength = uVar4;
  local_70 = (undefined1  [8])&unsigned_int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_ad5ca57;
  data.filename._0_4_ = 0x1bc;
  data.plusSize = (ulong)uVar4;
  pRVar7 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_70);
  data._32_8_ = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                          ((Memory *)pRVar7,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                           (ulong)uVar4);
  Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierSet(&this_00->mArgSizes,(uint *)data._32_8_);
  if (AVar3 == 0) {
    puVar1 = &(ptr_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
    *puVar1 = *puVar1 & 0xfb;
    count_00 = 0;
  }
  else {
    Js::ParseableFunctionInfo::SetInParamsCount(&ptr_00->super_ParseableFunctionInfo,AVar3 + 1);
    Js::ParseableFunctionInfo::SetReportedInParamsCount
              (&ptr_00->super_ParseableFunctionInfo,AVar3 + 1);
    local_70 = (undefined1  [8])&Js::AsmJsVarType::Which::typeinfo;
    data.typeinfo = (type_info *)0x0;
    count_00 = (ulong)AVar3;
    data.count = (size_t)anon_var_dwarf_ad5ca57;
    data.filename._0_4_ = 0x1c4;
    data.plusSize = count_00;
    pRVar7 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_70);
    ptr_02 = Memory::AllocateArray<Memory::Recycler,Js::AsmJsVarType::Which,false>
                       ((Memory *)pRVar7,(Recycler *)Memory::Recycler::AllocLeaf,0,count_00);
    Memory::WriteBarrierPtr<Js::AsmJsVarType::Which>::WriteBarrierSet(&this_00->mArgType,ptr_02);
  }
  for (uVar9 = 0; pWVar2 = (ptr->m_signature).ptr, count_00 != uVar9; uVar9 = uVar9 + 1) {
    AVar3 = (ArgSlot)uVar9;
    wasmType = WasmSignature::GetParam(pWVar2,AVar3);
    type = WasmToAsmJs::GetAsmJsVarType(wasmType);
    Js::AsmJsFunctionInfo::SetArgType(this_00,type,AVar3);
    AVar3 = WasmSignature::GetParamSize((ptr->m_signature).ptr,AVar3);
    *(uint *)(data._32_8_ + uVar9 * 4) = (uint)AVar3;
  }
  AVar3 = WasmSignature::GetParamsSize(pWVar2);
  this_00->mArgByteSize = AVar3;
  pWVar2 = (ptr->m_signature).ptr;
  uVar10 = pWVar2->m_resultsCount;
  if (uVar10 < 2) {
    wasmType_00 = Void;
    if (uVar10 == 1) {
      wasmType_00 = WasmSignature::GetResult(pWVar2,0);
    }
    AVar6 = WasmToAsmJs::GetAsmJsReturnType(wasmType_00);
    (this_00->mReturnType).which_ = AVar6.which_;
    return;
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException(this_01,L"Multi return values not supported");
LAB_00d6c356:
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

void WasmModuleGenerator::GenerateFunctionHeader(uint32 index)
{
    WasmFunctionInfo* wasmInfo = m_module->GetWasmFunctionInfo(index);
    if (!wasmInfo)
    {
        throw WasmCompilationException(_u("Invalid function index %u"), index);
    }

    const char16* functionName = nullptr;
    int nameLength = 0;

    if (wasmInfo->GetNameLength() > 0)
    {
        functionName = wasmInfo->GetName();
        nameLength = wasmInfo->GetNameLength();
    }
    else
    {
        for (uint32 iExport = 0; iExport < m_module->GetExportCount(); ++iExport)
        {
            Wasm::WasmExport* wasmExport = m_module->GetExport(iExport);
            if (wasmExport  &&
                wasmExport->kind == ExternalKinds::Function &&
                wasmExport->nameLength > 0 &&
                m_module->GetFunctionIndexType(wasmExport->index) == FunctionIndexTypes::Function &&
                wasmExport->index == wasmInfo->GetNumber())
            {
                nameLength = wasmExport->nameLength + 16;
                char16 * autoName = RecyclerNewArrayLeafZ(m_recycler, char16, nameLength);
                nameLength = swprintf_s(autoName, nameLength, _u("%s[%u]"), wasmExport->name, wasmInfo->GetNumber());
                functionName = autoName;
                break;
            }
        }
    }

    if (!functionName)
    {
        char16* autoName = RecyclerNewArrayLeafZ(m_recycler, char16, 32);
        nameLength = swprintf_s(autoName, 32, _u("wasm-function[%u]"), wasmInfo->GetNumber());
        functionName = autoName;
    }

    Js::FunctionBody* body = Js::FunctionBody::NewFromRecycler(
        m_scriptContext,
        functionName,
        nameLength,
        0,
        0,
        m_sourceInfo,
        m_sourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId,
        wasmInfo->GetNumber(),
        Js::FunctionInfo::Attributes::ErrorOnNew,
        Js::FunctionBody::Flags_None
#ifdef PERF_COUNTERS
        , false /* is function from deferred deserialized proxy */
#endif
    );
    wasmInfo->SetBody(body);
    // TODO (michhol): numbering
    body->SetSourceInfo(0);
    body->AllocateAsmJsFunctionInfo();
    body->SetIsAsmJsFunction(true);
    body->SetIsAsmjsMode(true);
    body->SetIsWasmFunction(true);

    WasmReaderInfo* readerInfo = RecyclerNew(m_recycler, WasmReaderInfo);
    readerInfo->m_funcInfo = wasmInfo;
    readerInfo->m_module = m_module;

    Js::WasmLibrary::ResetFunctionBodyDefaultEntryPoint(body);

    Js::AsmJsFunctionInfo* info = body->GetAsmJsFunctionInfo();
    info->SetWasmReaderInfo(readerInfo);
    info->SetWebAssemblyModule(m_module);

    Js::ArgSlot paramCount = wasmInfo->GetParamCount();
    info->SetArgCount(paramCount);
    info->SetWasmSignature(wasmInfo->GetSignature());
    Js::ArgSlot argSizeLength = max(paramCount, 3ui16);
    info->SetArgSizeArrayLength(argSizeLength);
    uint32* argSizeArray = RecyclerNewArrayLeafZ(m_recycler, uint32, argSizeLength);
    info->SetArgsSizesArray(argSizeArray);

    if (paramCount > 0)
    {
        // +1 here because asm.js includes the this pointer
        body->SetInParamsCount(paramCount + 1);
        body->SetReportedInParamsCount(paramCount + 1);
        info->SetArgTypeArray(RecyclerNewArrayLeaf(m_recycler, Js::AsmJsVarType::Which, paramCount));
    }
    else
    {
        // overwrite default value in this case
        body->SetHasImplicitArgIns(false);
    }
    for (Js::ArgSlot i = 0; i < paramCount; ++i)
    {
        WasmTypes::WasmType type = wasmInfo->GetSignature()->GetParam(i);
        info->SetArgType(WasmToAsmJs::GetAsmJsVarType(type), i);
        argSizeArray[i] = wasmInfo->GetSignature()->GetParamSize(i);
    }
    info->SetArgByteSize(wasmInfo->GetSignature()->GetParamsSize());
    if (wasmInfo->GetSignature()->GetResultCount() <= 1)
    {
        WasmTypes::WasmType returnType = wasmInfo->GetSignature()->GetResultCount() == 1 ? wasmInfo->GetSignature()->GetResult(0) : WasmTypes::Void;
        info->SetReturnType(WasmToAsmJs::GetAsmJsReturnType(returnType));
    }
    else
    {
        throw WasmCompilationException(_u("Multi return values not supported"));
    }
}